

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O1

sexp_conflict
sexp_bytevector_u32_set_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg1,sexp_conflict arg2,
          sexp_conflict arg3,sexp_conflict arg4)

{
  uint uVar1;
  sexp_conflict psVar2;
  uint uVar3;
  sexp psVar4;
  sexp psVar5;
  
  if ((((ulong)arg1 & 3) != 0) || (arg1->tag != 8)) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,8);
    return psVar2;
  }
  if ((((ulong)arg2 & 1) == 0) && ((((ulong)arg2 & 2) != 0 || (arg2->tag != 0xc)))) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg2);
    return psVar2;
  }
  if ((((ulong)arg3 & 1) == 0) && ((((ulong)arg3 & 2) != 0 || (arg3->tag != 0xc)))) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg3);
    return psVar2;
  }
  psVar5 = (sexp)((long)arg2 >> 1);
  psVar4 = psVar5;
  if (((ulong)arg2 & 1) == 0) {
    if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
      psVar4 = (sexp)((long)(arg2->value).flonum_bits[0] * (arg2->value).uvector.length);
    }
    else {
      psVar4 = (sexp)0x0;
    }
  }
  if (-1 < (long)psVar4) {
    psVar4 = psVar5;
    if (((ulong)arg2 & 1) == 0) {
      if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
        psVar4 = (sexp)((long)(arg2->value).flonum_bits[0] * (arg2->value).uvector.length);
      }
      else {
        psVar4 = (sexp)0x0;
      }
    }
    if (psVar4 < (arg1->value).type.name) {
      if (((ulong)arg2 & 1) == 0) {
        if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
          psVar5 = (sexp)((long)(arg2->value).flonum_bits[0] * (arg2->value).uvector.length);
        }
        else {
          psVar5 = (sexp)0x0;
        }
      }
      if (((ulong)arg3 & 1) == 0) {
        if ((((ulong)arg3 & 2) == 0) && (arg3->tag == 0xc)) {
          uVar3 = (int)(arg3->value).flonum_bits[0] * (int)(arg3->value).uvector.length;
        }
        else {
          uVar3 = 0;
        }
      }
      else {
        uVar3 = (uint)((long)arg3 >> 1);
      }
      uVar1 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      if ((((ctx->value).type.setters)->value).type.slots == arg4) {
        uVar1 = uVar3;
      }
      *(uint *)((long)&arg1->value + (long)(int)psVar5 + 8) = uVar1;
      return (sexp_conflict)0x43e;
    }
  }
  psVar2 = (sexp_conflict)
           sexp_user_exception_ls
                     (ctx,self,"assertion failed: (< -1 arg2 (bytevector-length arg1))",2,arg2,
                      (arg1->value).stack.length * 2 + 1);
  return psVar2;
}

Assistant:

sexp sexp_bytevector_u32_set_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg1, sexp arg2, sexp arg3, sexp arg4) {
  sexp res;
  if (! sexp_bytesp(arg1))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  if (! sexp_exact_integerp(arg3))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg3);
  if (!((-1 < sexp_sint_value(arg2)) && (sexp_sint_value(arg2) < sexp_bytes_length(arg1)))) {
    return sexp_user_exception_ls(ctx, self, "assertion failed: " "(< -1 arg2 (bytevector-length arg1))", 2, arg2, sexp_make_fixnum(sexp_bytes_length(arg1)));
  }
  res = ((bytevector_u32_set_x(ctx, sexp_bytes_data(arg1), sexp_sint_value(arg2), sexp_sint_value(arg3), arg4)), SEXP_VOID);
  return res;
}